

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absRef.c
# Opt level: O0

void Rnm_ManJustifyPropFanout_rec(Rnm_Man_t *p,Gia_Obj_t *pObj,int f,Vec_Int_t *vSelect)

{
  Rnm_Obj_t RVar1;
  int iVar2;
  uint uVar3;
  Rnm_Obj_t *pRVar4;
  Rnm_Obj_t *pRVar5;
  Gia_Obj_t *pGVar6;
  Gia_Obj_t *pGVar7;
  Rnm_Obj_t *pRnmF;
  int k;
  int i;
  Gia_Obj_t *pFanout;
  Rnm_Obj_t *pRnm;
  Rnm_Obj_t *pRnm1;
  Rnm_Obj_t *pRnm0;
  Vec_Int_t *vSelect_local;
  int f_local;
  Gia_Obj_t *pObj_local;
  Rnm_Man_t *p_local;
  
  pRVar4 = Rnm_ManObj(p,pObj,f);
  if (((uint)*pRVar4 >> 1 & 1) != 0) {
    __assert_fail("pRnm->fVisit == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absRef.c"
                  ,0x1db,
                  "void Rnm_ManJustifyPropFanout_rec(Rnm_Man_t *, Gia_Obj_t *, int, Vec_Int_t *)");
  }
  *pRVar4 = (Rnm_Obj_t)((uint)*pRVar4 & 0xfffffffd | 2);
  pRVar5 = Rnm_ManObj(p,pObj,0);
  if (((uint)*pRVar5 >> 2 & 1) == 0) {
    pRVar5 = Rnm_ManObj(p,pObj,0);
    *pRVar5 = (Rnm_Obj_t)((uint)*pRVar5 & 0xfffffffb | 4);
    p->nVisited = p->nVisited + 1;
  }
  if (((uint)*pRVar4 >> 3 & 1) == 0) {
    iVar2 = Gia_ObjIsCo(pObj);
    if (((iVar2 == 0) || (f != p->pCex->iFrame)) && (iVar2 = Gia_ObjIsPo(p->pGia,pObj), iVar2 == 0))
    {
      iVar2 = Gia_ObjIsRi(p->pGia,pObj);
      if (iVar2 == 0) {
        iVar2 = Gia_ObjIsRo(p->pGia,pObj);
        if ((iVar2 == 0) && (iVar2 = Gia_ObjIsAnd(pObj), iVar2 == 0)) {
          __assert_fail("Gia_ObjIsRo(p->pGia, pObj) || Gia_ObjIsAnd(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absRef.c"
                        ,500,
                        "void Rnm_ManJustifyPropFanout_rec(Rnm_Man_t *, Gia_Obj_t *, int, Vec_Int_t *)"
                       );
        }
        for (pRnmF._0_4_ = 0; iVar2 = Gia_ObjFanoutNum(p->pGia,pObj), (int)pRnmF < iVar2;
            pRnmF._0_4_ = (int)pRnmF + 1) {
          pGVar6 = Gia_ObjFanout(p->pGia,pObj,(int)pRnmF);
          if (((pGVar6->Value != 0) &&
              (pRVar4 = Rnm_ManObj(p,pGVar6,f), ((uint)*pRVar4 >> 3 & 1) == 0)) &&
             (((uint)*pRVar4 >> 1 & 1) == 0)) {
            iVar2 = Gia_ObjIsCo(pGVar6);
            if (iVar2 == 0) {
              iVar2 = Gia_ObjIsAnd(pGVar6);
              if (iVar2 == 0) {
                __assert_fail("Gia_ObjIsAnd(pFanout)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absRef.c"
                              ,0x202,
                              "void Rnm_ManJustifyPropFanout_rec(Rnm_Man_t *, Gia_Obj_t *, int, Vec_Int_t *)"
                             );
              }
              pGVar7 = Gia_ObjFanin0(pGVar6);
              pRVar4 = Rnm_ManObj(p,pGVar7,f);
              pGVar7 = Gia_ObjFanin1(pGVar6);
              pRVar5 = Rnm_ManObj(p,pGVar7,f);
              RVar1 = *pRVar4;
              uVar3 = Gia_ObjFaninC0(pGVar6);
              if ((((((uint)RVar1 & 1) == uVar3) && (((uint)*pRVar4 >> 1 & 1) != 0)) ||
                  ((RVar1 = *pRVar5, uVar3 = Gia_ObjFaninC1(pGVar6), ((uint)RVar1 & 1) == uVar3 &&
                   (((uint)*pRVar5 >> 1 & 1) != 0)))) ||
                 ((((RVar1 = *pRVar4, uVar3 = Gia_ObjFaninC0(pGVar6), ((uint)RVar1 & 1 ^ uVar3) == 1
                    && (((uint)*pRVar4 >> 1 & 1) != 0)) &&
                   (RVar1 = *pRVar5, uVar3 = Gia_ObjFaninC1(pGVar6), ((uint)RVar1 & 1 ^ uVar3) == 1)
                   ) && (((uint)*pRVar5 >> 1 & 1) != 0)))) {
                Rnm_ManJustifyPropFanout_rec(p,pGVar6,f,vSelect);
              }
            }
            else {
              Rnm_ManJustifyPropFanout_rec(p,pGVar6,f,vSelect);
            }
          }
        }
      }
      else {
        pGVar6 = Gia_ObjRiToRo(p->pGia,pObj);
        pRVar4 = Rnm_ManObj(p,pGVar6,f + 1);
        if (((uint)*pRVar4 >> 1 & 1) == 0) {
          Rnm_ManJustifyPropFanout_rec(p,pGVar6,f + 1,vSelect);
        }
      }
    }
  }
  else {
    if (((uint)*pRVar4 >> 4 & 0xffffff) == 0) {
      __assert_fail("(int)pRnm->Prio > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absRef.c"
                    ,0x1e4,
                    "void Rnm_ManJustifyPropFanout_rec(Rnm_Man_t *, Gia_Obj_t *, int, Vec_Int_t *)")
      ;
    }
    for (pRnmF._4_4_ = p->pCex->iFrame; -1 < pRnmF._4_4_; pRnmF._4_4_ = pRnmF._4_4_ + -1) {
      pRVar4 = Rnm_ManObj(p,pObj,pRnmF._4_4_);
      if (((uint)*pRVar4 >> 1 & 1) == 0) {
        Rnm_ManJustifyPropFanout_rec(p,pObj,pRnmF._4_4_,vSelect);
      }
    }
    iVar2 = Gia_ObjId(p->pGia,pObj);
    Vec_IntPush(vSelect,iVar2);
  }
  return;
}

Assistant:

void Rnm_ManJustifyPropFanout_rec( Rnm_Man_t * p, Gia_Obj_t * pObj, int f, Vec_Int_t * vSelect )
{
    Rnm_Obj_t * pRnm0, * pRnm1, * pRnm = Rnm_ManObj( p, pObj, f );
    Gia_Obj_t * pFanout = NULL;
    int i, k;//, Id = Gia_ObjId(p->pGia, pObj);
    assert( pRnm->fVisit == 0 );
    pRnm->fVisit = 1;
    if ( Rnm_ManObj( p, pObj, 0 )->fVisitJ == 0 )
    {
        Rnm_ManObj( p, pObj, 0 )->fVisitJ = 1;
        p->nVisited++;
    }
    if ( pRnm->fPPi )
    {
        assert( (int)pRnm->Prio > 0 );
        for ( i = p->pCex->iFrame; i >= 0; i-- )
            if ( !Rnm_ManObj(p, pObj, i)->fVisit )
                Rnm_ManJustifyPropFanout_rec( p, pObj, i, vSelect );
        Vec_IntPush( vSelect, Gia_ObjId(p->pGia, pObj) );
        return;
    }
    if ( (Gia_ObjIsCo(pObj) && f == p->pCex->iFrame) || Gia_ObjIsPo(p->pGia, pObj) )
        return;
    if ( Gia_ObjIsRi(p->pGia, pObj) )
    {
        pFanout = Gia_ObjRiToRo(p->pGia, pObj);
        if ( !Rnm_ManObj(p, pFanout, f+1)->fVisit )
            Rnm_ManJustifyPropFanout_rec( p, pFanout, f+1, vSelect );
        return;
    }
    assert( Gia_ObjIsRo(p->pGia, pObj) || Gia_ObjIsAnd(pObj) );
    Gia_ObjForEachFanoutStatic( p->pGia, pObj, pFanout, k )
    {
        Rnm_Obj_t * pRnmF;
        if ( pFanout->Value == 0 )
            continue;
        pRnmF = Rnm_ManObj(p, pFanout, f);
        if ( pRnmF->fPPi || pRnmF->fVisit )
            continue;
        if ( Gia_ObjIsCo(pFanout) )
        {
            Rnm_ManJustifyPropFanout_rec( p, pFanout, f, vSelect );
            continue;
        } 
        assert( Gia_ObjIsAnd(pFanout) );
        pRnm0 = Rnm_ManObj( p, Gia_ObjFanin0(pFanout), f );
        pRnm1 = Rnm_ManObj( p, Gia_ObjFanin1(pFanout), f );
        if ( ((pRnm0->Value ^ Gia_ObjFaninC0(pFanout)) == 0 && pRnm0->fVisit) ||
             ((pRnm1->Value ^ Gia_ObjFaninC1(pFanout)) == 0 && pRnm1->fVisit) || 
           ( ((pRnm0->Value ^ Gia_ObjFaninC0(pFanout)) == 1 && pRnm0->fVisit) && 
             ((pRnm1->Value ^ Gia_ObjFaninC1(pFanout)) == 1 && pRnm1->fVisit) ) )
           Rnm_ManJustifyPropFanout_rec( p, pFanout, f, vSelect );
    }
}